

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform_data.h
# Opt level: O1

void __thiscall
draco::AttributeTransformData::AppendParameterValue<float>
          (AttributeTransformData *this,float *in_data)

{
  ulong size;
  ulong uVar1;
  long lVar2;
  
  uVar1 = (long)(this->buffer_).data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->buffer_).data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar2 = (long)(int)uVar1;
  size = lVar2 + 4;
  if (uVar1 < size) {
    DataBuffer::Resize(&this->buffer_,size);
  }
  *(float *)((this->buffer_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar2) = *in_data;
  return;
}

Assistant:

void AppendParameterValue(const DataTypeT &in_data) {
    SetParameterValue(static_cast<int>(buffer_.data_size()), in_data);
  }